

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O2

_Bool testbinaryfuse16(size_t size)

{
  uint uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint64_t *keys;
  clock_t cVar4;
  clock_t cVar5;
  uint arity;
  long lVar6;
  uint32_t size_00;
  size_t i;
  uint64_t uVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  double dVar12;
  binary_fuse16_t local_58;
  size_t sVar7;
  
  iVar9 = 0;
  printf("testing binary fuse16 ");
  sVar7 = size;
  printf("size = %zu \n");
  size_00 = (uint32_t)sVar7;
  arity = (uint)size;
  local_58.Size = arity;
  if (arity == 0) {
    uVar10 = 4;
  }
  else {
    uVar3 = binary_fuse_calculate_segment_length(arity,size_00);
    uVar10 = 0x40000;
    if (uVar3 < 0x40000) {
      uVar10 = uVar3;
    }
  }
  uVar3 = uVar10 - 1;
  local_58.SegmentLength = uVar10;
  local_58.SegmentLengthMask = uVar3;
  if (1 < arity) {
    dVar12 = binary_fuse_calculate_size_factor(arity,size_00);
    dVar12 = round(dVar12 * (double)(size & 0xffffffff));
    iVar9 = (int)(long)dVar12;
  }
  uVar8 = 0;
  uVar1 = ((uVar3 - (iVar9 + uVar3) % uVar10) + iVar9 + uVar3) / uVar10;
  local_58.SegmentCount = 1;
  if (2 < uVar1) {
    local_58.SegmentCount = uVar1 - 2;
  }
  local_58.ArrayLength = (local_58.SegmentCount + 2) * uVar10;
  local_58.SegmentCountLength = local_58.SegmentCount * uVar10;
  local_58.Fingerprints = (uint16_t *)calloc((ulong)local_58.ArrayLength,2);
  keys = (uint64_t *)malloc(size * 8);
  for (; size != uVar8; uVar8 = uVar8 + 1) {
    keys[uVar8] = uVar8;
  }
  _Var2 = binary_fuse16_populate(keys,arity,&local_58);
  if (_Var2) {
    lVar6 = 5;
    while (bVar11 = lVar6 != 0, lVar6 = lVar6 + -1, bVar11) {
      cVar4 = clock();
      binary_fuse16_populate(keys,arity,&local_58);
      cVar5 = clock();
      printf("It took %f seconds to build an index over %zu values. \n",
             (double)(cVar5 - cVar4) / 1000000.0,size);
    }
    free(local_58.Fingerprints);
    free(keys);
  }
  return _Var2;
}

Assistant:

bool testbinaryfuse16(size_t size) {
  printf("testing binary fuse16 ");
  printf("size = %zu \n", size);

  binary_fuse16_t filter;

  binary_fuse16_allocate((uint32_t)size, &filter);
  // we need some set of values
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  for (size_t i = 0; i < size; i++) {
    big_set[i] = i; // we use contiguous values
  }
  // we construct the filter
  bool constructed = binary_fuse16_populate(big_set, (uint32_t)size, &filter); // warm the cache
  if(!constructed) { return false; }
  for (size_t times = 0; times < 5; times++) {
    clock_t t;
    t = clock();
    binary_fuse16_populate(big_set, (uint32_t)size, &filter);
    t = clock() - t;
    double time_taken = ((double)t) / CLOCKS_PER_SEC; // in seconds
    printf("It took %f seconds to build an index over %zu values. \n",
           time_taken, size);
  }
  binary_fuse16_free(&filter);
  free(big_set);
  return true;
}